

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urandom_test.cc
# Opt level: O1

void anon_unknown.dwarf_532c::GetTrace
               (vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                *out_trace,uint flags,function<void_()> *thunk)

{
  bool bVar1;
  bool bVar2;
  internal iVar3;
  bool bVar4;
  __pid_t _Var5;
  int iVar6;
  size_t i;
  long lVar7;
  int *piVar8;
  size_t sVar9;
  undefined8 extraout_RAX;
  undefined1 auVar10 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  uint uVar12;
  ostream *poVar13;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar14;
  char *pcVar15;
  pointer pcVar16;
  char *in_R9;
  byte bVar17;
  uint uVar18;
  ulong uVar19;
  uint unaff_R14D;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__n;
  bool bVar21;
  bool bVar22;
  int child_pid;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__7;
  int status;
  uint64_t socket_read_bytes;
  uint8_t *src;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  uint local_3a8;
  uint local_3a4;
  undefined1 local_3a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  AssertHelper local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_378;
  AssertHelper local_370;
  uint local_368;
  uint local_364;
  vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_> *local_360;
  int local_354;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_350;
  uint local_348;
  int local_344;
  undefined8 *local_340;
  undefined1 local_338 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  size_type local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310 [5];
  undefined8 local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  undefined1 local_138 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130 [2];
  uint local_120;
  undefined4 uStack_11c;
  int local_118;
  undefined1 local_110 [216];
  AssertHelper local_38;
  
  local_3a4 = fork();
  local_138._0_4_ = 0xffffffff;
  testing::internal::CmpHelperNE<int,int>
            ((internal *)local_338,"-1","child_pid",(int *)local_138,(int *)&local_3a4);
  if (local_338[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_138);
    if (local_330 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = (local_330->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
               ,0x18a,pcVar16);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3a0,(Message *)local_138);
  }
  else {
    if (local_330 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_330,local_330);
    }
    if (local_3a4 == 0) {
      lVar7 = ptrace(PTRACE_TRACEME,0,0,0);
      if (lVar7 != 0) {
        _GLOBAL__N_1::GetTrace();
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (local_3a0 != (undefined1  [8])&local_390) {
          operator_delete((void *)local_3a0,
                          CONCAT71(local_390._M_allocated_capacity._1_7_,local_390._M_local_buf[0])
                          + 1);
        }
        if (local_370.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_370.data_ + 8))();
        }
        local_370.data_ = (AssertHelperData *)0x0;
        if (local_378 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_378,local_378);
        }
        _Unwind_Resume(extraout_RAX);
      }
      raise(0x13);
      std::function<void_()>::operator()(thunk);
      _exit(0);
    }
    _Var5 = waitpid(local_3a4,(int *)&local_364,0);
    local_138._0_4_ = _Var5;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_338,"child_pid","waitpid(child_pid, &status, 0)",(int *)&local_3a4,
               (int *)local_138);
    if (local_338[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_138);
      if (local_330 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar16 = "";
      }
      else {
        pcVar16 = (local_330->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_3a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                 ,0x199,pcVar16);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_3a0,(Message *)local_138);
    }
    else {
      if (local_330 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_330,local_330);
      }
      local_138[0] = (short)local_364 == 0x137f;
      local_130[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((short)local_364 != 0x137f) {
        pdVar14 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_130;
        testing::Message::Message((Message *)local_3a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)local_3a0 + 0x10),"Child was not stopped with SIGSTOP: ",0x24);
        std::ostream::operator<<((ostream *)((long)local_3a0 + 0x10),local_364);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_338,(internal *)local_138,
                   (AssertionResult *)
                   "(((status) & 0xff) == 0x7f) && (((status) & 0xff00) >> 8) == 19","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_380,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                   ,0x19a,(char *)local_338);
        testing::internal::AssertHelper::operator=(&local_380,(Message *)local_3a0);
        testing::internal::AssertHelper::~AssertHelper(&local_380);
        if (local_338 != (undefined1  [8])&local_328) {
          operator_delete((void *)local_338,
                          CONCAT44(local_328._M_allocated_capacity._4_4_,
                                   local_328._M_allocated_capacity._0_4_) + 1);
        }
        if (local_3a0 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_3a0 + 8))();
        }
        pbVar11 = local_130[0];
        if (local_130[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           ) {
          return;
        }
        goto LAB_0011daac;
      }
      local_3a0 = (undefined1  [8])((ulong)local_3a0 & 0xffffffff00000000);
      local_138 = (undefined1  [8])ptrace(PTRACE_SETOPTIONS,(ulong)local_3a4,0,0x100001);
      testing::internal::CmpHelperEQ<int,long>
                ((internal *)local_338,"0",
                 "ptrace(PTRACE_SETOPTIONS, child_pid, nullptr, (1 << 20) | PTRACE_O_TRACESYSGOOD)",
                 (int *)local_3a0,(long *)local_138);
      if (local_338[0] != (internal)0x0) {
        local_368 = flags;
        if (local_330 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_330,local_330);
        }
        local_354 = -1;
        local_344 = -1;
        local_360 = out_trace;
        local_3a8 = unaff_R14D;
        while( true ) {
          local_3a0 = (undefined1  [8])((ulong)local_3a0 & 0xffffffff00000000);
          local_138 = (undefined1  [8])ptrace(PTRACE_SYSCALL,(ulong)local_3a4,0,0);
          testing::internal::CmpHelperEQ<int,long>
                    ((internal *)local_338,"0","ptrace(PTRACE_SYSCALL, child_pid, 0, 0)",
                     (int *)local_3a0,(long *)local_138);
          if (local_338[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_138);
            if (local_330 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar16 = "";
            }
            else {
              pcVar16 = (local_330->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_3a0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                       ,0x1b0,pcVar16);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_3a0,(Message *)local_138);
            goto LAB_0011da80;
          }
          if (local_330 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_330,local_330);
          }
          _Var5 = waitpid(local_3a4,(int *)&local_364,0);
          local_138._0_4_ = _Var5;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_338,"child_pid","waitpid(child_pid, &status, 0)",
                     (int *)&local_3a4,(int *)local_138);
          if (local_338[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_138);
            if (local_330 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar16 = "";
            }
            else {
              pcVar16 = (local_330->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_3a0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                       ,0x1b1,pcVar16);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_3a0,(Message *)local_138);
            goto LAB_0011da80;
          }
          if (local_330 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_330,local_330);
          }
          if ((short)local_364 == 0x67f) {
            local_338._0_4_ = kAbort;
            local_330 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_328._M_allocated_capacity._0_4_ = 0;
            local_318 = 0;
            local_310[0]._M_local_buf[0] = '\0';
            local_328._8_8_ = local_310;
            std::vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
            ::push_back(out_trace,(value_type *)local_338);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._8_8_ == local_310) {
              return;
            }
            operator_delete((void *)local_328._8_8_,
                            CONCAT71(local_310[0]._M_allocated_capacity._1_7_,
                                     local_310[0]._M_local_buf[0]) + 1);
            return;
          }
          local_138[0] = (short)local_364 == -0x7a81;
          local_130[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((short)local_364 != -0x7a81) break;
          bVar4 = regs_read((regs *)local_138,local_3a4);
          local_3a0[0] = (internal)bVar4;
          local_398 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (bVar4) {
LAB_0011c7c6:
            uVar18 = local_3a4;
            local_350 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((long)local_138 < 0x29) {
              if (local_138 != (undefined1  [8])0x0) {
                if (local_138 != (undefined1  [8])0x2) {
                  if (((local_138 == (undefined1  [8])0x3) && (-1 < local_354)) &&
                     (local_354 == (int)local_130[0])) {
                    local_338._0_4_ = 6;
                    local_330 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0;
                    local_328._M_allocated_capacity._0_4_ = 0;
                    local_318 = 0;
                    local_310[0]._M_local_buf[0] = '\0';
                    local_328._8_8_ = local_310;
                    std::
                    vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                    ::push_back(out_trace,(value_type *)local_338);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_328._8_8_ != local_310) {
                      operator_delete((void *)local_328._8_8_,
                                      CONCAT71(local_310[0]._M_allocated_capacity._1_7_,
                                               local_310[0]._M_local_buf[0]) + 1);
                    }
                    local_354 = -1;
                  }
                  goto LAB_0011c985;
                }
LAB_0011c993:
                pbVar11 = local_130[local_138 == (undefined1  [8])0x101];
                local_3a0 = (undefined1  [8])&local_390;
                local_398 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                ;
                local_390._M_local_buf[0] = '\0';
                while( true ) {
                  local_338 = (undefined1  [8])
                              ptrace(PTRACE_PEEKDATA,(ulong)uVar18,
                                     (ulong)pbVar11 & 0xfffffffffffffff8,0);
                  if (local_338[(uint)pbVar11 & 7] == '\0') break;
                  std::__cxx11::string::push_back((char)local_3a0);
                  pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar11->_M_dataplus)._M_p + 1);
                }
                lVar7 = std::__cxx11::string::find((char *)local_3a0,0x1be463,0);
                if (lVar7 != 0) {
                  Event::Open((Event *)local_338,(string *)local_3a0);
                  std::
                  vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                  ::push_back(out_trace,(Event *)local_338);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_328._8_8_ != local_310) {
                    operator_delete((void *)local_328._8_8_,
                                    CONCAT71(local_310[0]._M_allocated_capacity._1_7_,
                                             local_310[0]._M_local_buf[0]) + 1);
                  }
                }
                iVar6 = std::__cxx11::string::compare(local_3a0);
                bVar21 = iVar6 == 0;
                bVar17 = (byte)((local_368 & 2) >> 1) & bVar21;
                uVar18 = (uint)bVar17;
                if (bVar17 != 0) {
                  local_3a8 = 0xfffffffe;
                }
                if (local_3a0 != (undefined1  [8])&local_390) {
                  operator_delete((void *)local_3a0,
                                  CONCAT71(local_390._M_allocated_capacity._1_7_,
                                           local_390._M_local_buf[0]) + 1);
                }
                bVar22 = false;
                goto LAB_0011cc0b;
              }
              if (local_344 == (int)local_130[0] && -1 < local_344) {
                local_330 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(uStack_11c,local_120);
                local_338._0_4_ = 2;
                local_328._M_allocated_capacity._0_4_ = 0;
                local_318 = 0;
                local_310[0]._M_local_buf[0] = '\0';
                local_328._8_8_ = local_310;
                std::
                vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                ::push_back(out_trace,(value_type *)local_338);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_328._8_8_ != local_310) {
                  operator_delete((void *)local_328._8_8_,
                                  CONCAT71(local_310[0]._M_allocated_capacity._1_7_,
                                           local_310[0]._M_local_buf[0]) + 1);
                }
                if ((local_368 & 0x10) != 0) {
                  local_3a8 = 0xffffffea;
                }
                uVar18 = (local_368 & 0x10) >> 4;
                bVar4 = true;
                bVar2 = false;
              }
              else if (local_354 == (int)local_130[0] && -1 < local_354) {
                pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(uStack_11c,local_120);
                local_338._0_4_ = 5;
                local_328._M_allocated_capacity._0_4_ = 0;
                local_318 = 0;
                local_310[0]._M_local_buf[0] = '\0';
                local_330 = pbVar11;
                local_328._8_8_ = local_310;
                std::
                vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                ::push_back(out_trace,(value_type *)local_338);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_328._8_8_ != local_310) {
                  operator_delete((void *)local_328._8_8_,
                                  CONCAT71(local_310[0]._M_allocated_capacity._1_7_,
                                           local_310[0]._M_local_buf[0]) + 1);
                }
                if ((char)local_368 < '\0') {
                  uVar18 = 1;
                  local_3a8 = 0xffffffea;
                  bVar2 = false;
                }
                else {
                  bVar2 = true;
                  local_350 = pbVar11;
                  if ((local_368 >> 8 & 1) != 0) {
                    local_3a0 = (undefined1  [8])((ulong)local_3a0 & 0xffffffff00000000);
                    testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
                              ((internal *)local_338,"socket_read_bytes","0u",
                               (unsigned_long *)&local_350,(uint *)local_3a0);
                    if (local_338[0] == (internal)0x0) {
                      testing::Message::Message((Message *)local_3a0);
                      pcVar15 = "";
                      if (local_330 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar15 = (local_330->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_380,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                                 ,0x1ff,pcVar15);
                      testing::internal::AssertHelper::operator=(&local_380,(Message *)local_3a0);
                      testing::internal::AssertHelper::~AssertHelper(&local_380);
                      if (local_3a0 != (undefined1  [8])0x0) {
                        (**(code **)(*(size_type *)local_3a0 + 8))();
                      }
                      if (local_330 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_330,local_330);
                      }
                      uVar18 = 0;
                      bVar4 = false;
                      goto LAB_0011d261;
                    }
                    if (local_330 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_330,local_330);
                    }
                    local_350 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&local_350[-1].field_2 + 0xf);
                    local_368 = local_368 & 0xfffffe7f;
                  }
                  uVar18 = 0;
                }
                bVar4 = true;
              }
              else {
                bVar4 = true;
                uVar18 = 0;
                bVar2 = false;
              }
LAB_0011d261:
              bVar1 = false;
              bVar21 = false;
              bVar22 = false;
              out_trace = local_360;
              if (!bVar4) goto LAB_0011cf4c;
            }
            else {
              if ((long)local_138 < 0x101) {
                if (local_138 == (undefined1  [8])0x29) {
                  bVar4 = ((ulong)local_130[1] & 0xffffffff) == 1;
                  bVar22 = bVar4 && (int)local_130[0] == 1;
                  if (bVar4 && (int)local_130[0] == 1) {
                    local_338._0_4_ = 3;
                    local_330 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0;
                    local_328._M_allocated_capacity._0_4_ = 0;
                    local_318 = 0;
                    local_310[0]._M_local_buf[0] = '\0';
                    local_328._8_8_ = local_310;
                    std::
                    vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                    ::push_back(local_360,(value_type *)local_338);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_328._8_8_ != local_310) {
                      operator_delete((void *)local_328._8_8_,
                                      CONCAT71(local_310[0]._M_allocated_capacity._1_7_,
                                               local_310[0]._M_local_buf[0]) + 1);
                    }
                    if ((local_368 & 0x20) != 0) {
                      local_3a8 = 0xffffffea;
                    }
                    uVar18 = (local_368 & 0x20) >> 5;
                    bVar22 = true;
                    bVar21 = false;
                  }
                  else {
                    uVar18 = 0;
                    bVar21 = false;
                  }
                  goto LAB_0011cc0b;
                }
                if (((local_138 == (undefined1  [8])0x2a) && (-1 < local_354)) &&
                   (local_354 == (int)local_130[0])) {
                  local_338._0_4_ = 4;
                  local_330 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                  local_328._M_allocated_capacity._0_4_ = 0;
                  local_318 = 0;
                  local_310[0]._M_local_buf[0] = '\0';
                  local_328._8_8_ = local_310;
                  std::
                  vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                  ::push_back(out_trace,(value_type *)local_338);
                  uVar12 = local_368;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_328._8_8_ != local_310) {
                    operator_delete((void *)local_328._8_8_,
                                    CONCAT71(local_310[0]._M_allocated_capacity._1_7_,
                                             local_310[0]._M_local_buf[0]) + 1);
                  }
                  uVar18 = 1;
                  local_3a8 = (int)(uVar12 << 0x19) >> 0x1f & 0xffffffea;
                }
                else {
LAB_0011c985:
                  uVar18 = 0;
                }
              }
              else {
                if (local_138 == (undefined1  [8])0x101) goto LAB_0011c993;
                if (local_138 != (undefined1  [8])0x13e) goto LAB_0011c985;
                uVar12 = 0xffffffda;
                uVar18 = 1;
                if (((local_368 & 1) == 0) && (uVar12 = 0xffffffea, (local_368 & 8) == 0)) {
                  uVar12 = local_3a8;
                  if ((local_368 & 4) == 0) {
                    uVar18 = 0;
                  }
                  else {
                    uVar18 = local_120;
                    if ((local_120 & 1) != 0) {
                      uVar12 = 0xfffffff5;
                    }
                  }
                }
                local_338 = (undefined1  [8])((ulong)(uint)local_338._4_4_ << 0x20);
                local_318 = 0;
                local_310[0]._M_local_buf[0] = '\0';
                local_330 = local_130[1];
                local_328._M_allocated_capacity._0_4_ = local_120;
                local_328._8_8_ = local_310;
                std::
                vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                ::push_back(out_trace,(value_type *)local_338);
                local_3a8 = uVar12;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_328._8_8_ != local_310) {
                  operator_delete((void *)local_328._8_8_,
                                  CONCAT71(local_310[0]._M_allocated_capacity._1_7_,
                                           local_310[0]._M_local_buf[0]) + 1);
                }
              }
              bVar21 = false;
              bVar22 = false;
LAB_0011cc0b:
              bVar2 = false;
            }
            uVar12 = local_3a4;
            if ((uVar18 & 1) == 0) {
LAB_0011cd3d:
              local_380.data_ = local_380.data_ & 0xffffffff00000000;
              local_3a0 = (undefined1  [8])ptrace(PTRACE_SYSCALL,(ulong)local_3a4,0,0);
              testing::internal::CmpHelperEQ<int,long>
                        ((internal *)local_338,"0","ptrace(PTRACE_SYSCALL, child_pid, 0, 0)",
                         (int *)&local_380,(long *)local_3a0);
              if (local_338[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_3a0);
                out_trace = local_360;
                pcVar16 = "";
                if (local_330 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar16 = (local_330->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_380,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                           ,0x232,pcVar16);
                testing::internal::AssertHelper::operator=(&local_380,(Message *)local_3a0);
LAB_0011cf1a:
                testing::internal::AssertHelper::~AssertHelper(&local_380);
                if (local_3a0 != (undefined1  [8])0x0) {
                  (**(code **)(*(size_type *)local_3a0 + 8))();
                }
              }
              else {
                if (local_330 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_330,local_330);
                }
                _Var5 = waitpid(local_3a4,(int *)&local_364,0);
                local_3a0._0_4_ = _Var5;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_338,"child_pid","waitpid(child_pid, &status, 0)",
                           (int *)&local_3a4,(int *)local_3a0);
                if (local_338[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_3a0);
                  out_trace = local_360;
                  pcVar16 = "";
                  if (local_330 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar16 = (local_330->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_380,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                             ,0x233,pcVar16);
                  testing::internal::AssertHelper::operator=(&local_380,(Message *)local_3a0);
                  goto LAB_0011cf1a;
                }
                if (local_330 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_330,local_330);
                }
                out_trace = local_360;
                if ((local_364 & 0x7f) != 0) {
                  bVar4 = (local_364 & 0xffff) == 0x857f;
                  local_3a0[0] = (internal)bVar4;
                  local_398 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                  if (!bVar4) {
                    testing::Message::Message((Message *)&local_380);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_338,(internal *)local_3a0,
                               (AssertionResult *)
                               "(((status) & 0xff) == 0x7f) && (((status) & 0xff00) >> 8) == (5 | 0x80)"
                               ,"false","true",in_R9);
                    out_trace = local_360;
                    testing::internal::AssertHelper::AssertHelper
                              (&local_370,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                               ,0x23e,(char *)local_338);
                    testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_380);
                    goto LAB_0011cce3;
                  }
                  if ((uVar18 & 1) == 0) {
                    if (bVar21) {
                      bVar4 = regs_read((regs *)local_138,local_3a4);
                      local_3a0[0] = (internal)bVar4;
                      local_398 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0;
                      out_trace = local_360;
                      if (!bVar4) {
                        testing::Message::Message((Message *)&local_380);
                        out_trace = local_360;
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_338,(internal *)local_3a0,
                                   (AssertionResult *)"regs_read(&regs, child_pid)","false","true",
                                   in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_370,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                                   ,0x243,(char *)local_338);
                        testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_380)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_370);
                        if (local_338 != (undefined1  [8])&local_328) {
                          operator_delete((void *)local_338,
                                          CONCAT44(local_328._M_allocated_capacity._4_4_,
                                                   local_328._M_allocated_capacity._0_4_) + 1);
                        }
                        if (local_380.data_ != (AssertHelperData *)0x0) {
                          (**(code **)(*(long *)local_380.data_ + 8))();
                        }
                        if (local_398 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_398,local_398);
                        }
                        if (!bVar4) goto LAB_0011cf46;
                      }
                      local_344 = local_118;
                    }
                    else {
                      if (!bVar22) {
                        if (!bVar2) goto LAB_0011ce5a;
                        local_380.data_ = (AssertHelperData *)&DAT_000001f0;
                        testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                                  ((internal *)local_3a0,"socket_read_bytes","sizeof(entropy)",
                                   (unsigned_long *)&local_350,(unsigned_long *)&local_380);
                        if (local_3a0[0] != (internal)0x0) {
                          if (local_398 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_398,local_398);
                          }
                          lVar7 = 0;
                          do {
                            local_338[lVar7] = (char)lVar7;
                            lVar7 = lVar7 + 1;
                          } while (lVar7 != 0x1f0);
                          local_348 = local_3a4;
                          pbVar11 = local_130[1];
                          pbVar20 = local_350;
                          local_340 = (undefined8 *)local_338;
                          do {
                            uVar18 = local_348;
                            if (pbVar20 ==
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) break;
                            uVar19 = (ulong)((uint)pbVar11 & 7);
                            __n = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(8 - uVar19);
                            if (pbVar20 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)(8 - uVar19)) {
                              __n = pbVar20;
                            }
                            local_140 = pbVar11;
                            if (__n == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)0x8 && uVar19 == 0) {
                              auVar10 = (undefined1  [8])*local_340;
                            }
                            else {
                              local_3a0 = (undefined1  [8])
                                          ptrace(PTRACE_PEEKDATA,(ulong)local_348,
                                                 (ulong)pbVar11 & 0xfffffffffffffff8,0);
                              memcpy(local_3a0 + uVar19,local_340,(size_t)__n);
                              auVar10 = local_3a0;
                            }
                            local_370.data_ = local_370.data_ & 0xffffffff00000000;
                            local_380.data_ =
                                 (AssertHelperData *)
                                 ptrace(PTRACE_POKEDATA,(ulong)uVar18,
                                        (ulong)pbVar11 & 0xfffffffffffffff8,auVar10);
                            testing::internal::CmpHelperEQ<int,long>
                                      ((internal *)local_3a0,"0",
                                       "ptrace(PTRACE_POKEDATA, child_pid, reinterpret_cast<void *>(aligned_addr), reinterpret_cast<void *>(word))"
                                       ,(int *)&local_370,(long *)&local_380);
                            iVar3 = local_3a0[0];
                            if (local_3a0[0] == (internal)0x0) {
                              testing::Message::Message((Message *)&local_380);
                              pcVar15 = "";
                              if (local_398 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                pcVar15 = (local_398->_M_dataplus)._M_p;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_370,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                                         ,0x15c,pcVar15);
                              testing::internal::AssertHelper::operator=
                                        (&local_370,(Message *)&local_380);
                              testing::internal::AssertHelper::~AssertHelper(&local_370);
                              if (local_380.data_ != (AssertHelperData *)0x0) {
                                (**(code **)(*(long *)local_380.data_ + 8))();
                              }
                              pbVar11 = local_140;
                              if (local_398 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_398,local_398);
                                pbVar11 = local_140;
                              }
                            }
                            else {
                              if (local_398 !=
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_398,local_398);
                              }
                              local_340 = (undefined8 *)((long)local_340 + (long)__n);
                              pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)pbVar20 - (long)__n);
                              pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&(local_140->_M_dataplus)._M_p +
                                           (long)&(__n->_M_dataplus)._M_p);
                            }
                          } while (iVar3 != (internal)0x0);
                          bVar4 = regs_set_ret(local_3a4,(int)local_350);
                          local_380.data_._0_1_ = bVar4;
                          local_378 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0;
                          if (!bVar4) {
                            testing::Message::Message((Message *)&local_370);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_3a0,(internal *)&local_380,
                                       (AssertionResult *)
                                       "regs_set_ret(child_pid, socket_read_bytes)","false","true",
                                       in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_38,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                                       ,0x253,(char *)local_3a0);
                            testing::internal::AssertHelper::operator=
                                      (&local_38,(Message *)&local_370);
                            testing::internal::AssertHelper::~AssertHelper(&local_38);
                            if (local_3a0 != (undefined1  [8])&local_390) {
                              operator_delete((void *)local_3a0,
                                              CONCAT71(local_390._M_allocated_capacity._1_7_,
                                                       local_390._M_local_buf[0]) + 1);
                            }
                            if (local_370.data_ != (AssertHelperData *)0x0) {
                              (**(code **)(*(long *)local_370.data_ + 8))();
                            }
                            if (local_378 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              pdVar14 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&local_378;
                              pbVar11 = local_378;
                              goto LAB_0011d33a;
                            }
                            goto LAB_0011d33f;
                          }
                          goto LAB_0011d898;
                        }
                        testing::Message::Message((Message *)&local_380);
                        pcVar16 = "";
                        if (local_398 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar16 = (local_398->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_370,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                                   ,0x24c,pcVar16);
                        testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_380)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_370);
                        goto LAB_0011cd0d;
                      }
                      bVar4 = regs_read((regs *)local_138,local_3a4);
                      out_trace = local_360;
                      local_3a0[0] = (internal)bVar4;
                      local_398 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0;
                      if (!bVar4) {
                        testing::Message::Message((Message *)&local_380);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_338,(internal *)local_3a0,
                                   (AssertionResult *)"regs_read(&regs, child_pid)","false","true",
                                   in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_370,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                                   ,0x246,(char *)local_338);
                        testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_380)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_370);
                        if (local_338 != (undefined1  [8])&local_328) {
                          operator_delete((void *)local_338,
                                          CONCAT44(local_328._M_allocated_capacity._4_4_,
                                                   local_328._M_allocated_capacity._0_4_) + 1);
                        }
                        if (local_380.data_ != (AssertHelperData *)0x0) {
                          (**(code **)(*(long *)local_380.data_ + 8))();
                        }
                        if (local_398 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_398,local_398);
                        }
                        if (!bVar4) goto LAB_0011cf46;
                      }
                      local_354 = local_118;
                    }
                  }
                  else {
                    bVar4 = regs_set_ret(local_3a4,local_3a8);
                    local_3a0[0] = (internal)bVar4;
                    local_398 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0;
                    if (bVar4) {
LAB_0011ce5a:
                      local_398 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0;
                      out_trace = local_360;
                    }
                    else {
                      testing::Message::Message((Message *)&local_380);
                      out_trace = local_360;
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)local_338,(internal *)local_3a0,
                                 (AssertionResult *)"regs_set_ret(child_pid, force_result.value())",
                                 "false","true",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_370,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                                 ,0x241,(char *)local_338);
                      testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_380);
                      testing::internal::AssertHelper::~AssertHelper(&local_370);
                      if (local_338 != (undefined1  [8])&local_328) {
                        operator_delete((void *)local_338,
                                        CONCAT44(local_328._M_allocated_capacity._4_4_,
                                                 local_328._M_allocated_capacity._0_4_) + 1);
                      }
                      if (local_380.data_ != (AssertHelperData *)0x0) {
                        (**(code **)(*(long *)local_380.data_ + 8))();
                      }
                      if (local_398 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pdVar14 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&local_398;
                        pbVar11 = local_398;
LAB_0011d33a:
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()(pdVar14,pbVar11);
                      }
LAB_0011d33f:
                      if (bVar4 == false) goto LAB_0011cf46;
                    }
                  }
LAB_0011d898:
                  bVar1 = true;
                  goto LAB_0011cf4c;
                }
                local_3a0 = (undefined1  [8])((ulong)local_3a0 & 0xffffffff00000000);
                local_380.data_ =
                     (AssertHelperData *)
                     (CONCAT44(local_380.data_._4_4_,local_364 >> 8) & 0xffffffff000000ff);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_338,"0","(((status) & 0xff00) >> 8)",(int *)local_3a0,
                           (int *)&local_380);
                out_trace = local_360;
                if (local_338[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_3a0);
                  pcVar16 = "";
                  if (local_330 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar16 = (local_330->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_380,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                             ,0x237,pcVar16);
                  testing::internal::AssertHelper::operator=(&local_380,(Message *)local_3a0);
                  goto LAB_0011cf1a;
                }
              }
              if (local_330 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pdVar14 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_330;
                pbVar11 = local_330;
                goto LAB_0011cf41;
              }
            }
            else {
              memcpy(local_338,local_110,0xd8);
              local_2c0 = 0xffffffffffffffff;
              lVar7 = ptrace(PTRACE_SETREGS,(ulong)uVar12,0,local_338);
              local_3a0[0] = (internal)(lVar7 == 0);
              local_398 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (lVar7 == 0) goto LAB_0011cd3d;
              testing::Message::Message((Message *)&local_380);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_338,(internal *)local_3a0,
                         (AssertionResult *)"regs_break_syscall(child_pid, &regs)","false","true",
                         in_R9);
              out_trace = local_360;
              testing::internal::AssertHelper::AssertHelper
                        (&local_370,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                         ,0x22f,(char *)local_338);
              testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_380);
LAB_0011cce3:
              testing::internal::AssertHelper::~AssertHelper(&local_370);
              if (local_338 != (undefined1  [8])&local_328) {
                operator_delete((void *)local_338,
                                CONCAT44(local_328._M_allocated_capacity._4_4_,
                                         local_328._M_allocated_capacity._0_4_) + 1);
              }
LAB_0011cd0d:
              if (local_380.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_380.data_ + 8))();
              }
              if (local_398 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pdVar14 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_398;
                pbVar11 = local_398;
LAB_0011cf41:
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()(pdVar14,pbVar11);
              }
            }
LAB_0011cf46:
            bVar1 = false;
          }
          else {
            testing::Message::Message((Message *)&local_380);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_338,(internal *)local_3a0,
                       (AssertionResult *)"regs_read(&regs, child_pid)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_370,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                       ,0x1be,(char *)local_338);
            testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_380);
            testing::internal::AssertHelper::~AssertHelper(&local_370);
            if (local_338 != (undefined1  [8])&local_328) {
              operator_delete((void *)local_338,
                              CONCAT44(local_328._M_allocated_capacity._4_4_,
                                       local_328._M_allocated_capacity._0_4_) + 1);
            }
            if (local_380.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_380.data_ + 8))();
            }
            if (local_398 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_398,local_398);
            }
            if (bVar4) goto LAB_0011c7c6;
            bVar1 = false;
          }
LAB_0011cf4c:
          if (!bVar1) {
            return;
          }
        }
        testing::Message::Message((Message *)local_3a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)local_3a0 + 0x10),"Child was not stopped with a syscall stop: "
                   ,0x2b);
        std::ostream::operator<<((ostream *)((long)local_3a0 + 0x10),local_364);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_338,(internal *)local_138,
                   (AssertionResult *)
                   "(((status) & 0xff) == 0x7f) && (((status) & 0xff00) >> 8) == (5 | 0x80)","false"
                   ,"true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_380,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                   ,0x1ba,(char *)local_338);
        testing::internal::AssertHelper::operator=(&local_380,(Message *)local_3a0);
        testing::internal::AssertHelper::~AssertHelper(&local_380);
        if (local_338 != (undefined1  [8])&local_328) {
          operator_delete((void *)local_338,
                          CONCAT44(local_328._M_allocated_capacity._4_4_,
                                   local_328._M_allocated_capacity._0_4_) + 1);
        }
        if (local_3a0 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_3a0 + 8))();
        }
        if (local_130[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
           ) {
          return;
        }
        pdVar14 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_130;
        pbVar11 = local_130[0];
        goto LAB_0011daac;
      }
      testing::Message::Message((Message *)local_138);
      piVar8 = __errno_location();
      pcVar15 = strerror(*piVar8);
      poVar13 = (ostream *)((long)local_138 + 0x10);
      if (pcVar15 == (char *)0x0) {
        sVar9 = 6;
        pcVar15 = "(null)";
      }
      else {
        sVar9 = strlen(pcVar15);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar15,sVar9);
      if (local_330 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar16 = "";
      }
      else {
        pcVar16 = (local_330->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_3a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                 ,0x1a3,pcVar16);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_3a0,(Message *)local_138);
    }
  }
LAB_0011da80:
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3a0);
  if (local_138 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_138 + 8))();
  }
  if (local_330 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
  pdVar14 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_330;
  pbVar11 = local_330;
LAB_0011daac:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(pdVar14,pbVar11);
  return;
}

Assistant:

static void GetTrace(std::vector<Event> *out_trace, unsigned flags,
                     std::function<void()> thunk) {
  const int child_pid = fork();
  ASSERT_NE(-1, child_pid);

  if (child_pid == 0) {
    // Child process
    if (ptrace(PTRACE_TRACEME, 0, 0, 0) != 0) {
      perror("PTRACE_TRACEME");
      _exit(1);
    }
    raise(SIGSTOP);
    thunk();
    _exit(0);
  }

  // Parent process
  int status;
  ASSERT_EQ(child_pid, waitpid(child_pid, &status, 0));
  ASSERT_TRUE(WIFSTOPPED(status) && WSTOPSIG(status) == SIGSTOP)
      << "Child was not stopped with SIGSTOP: " << status;

  // Set options so that:
  //   a) the child process is killed once this process dies.
  //   b) System calls result in a WSTOPSIG value of (SIGTRAP | 0x80) rather
  //      than just SIGTRAP. (This doesn't matter here, but it's recommended
  //      practice so that it's distinct from the signal itself.)
  ASSERT_EQ(0, ptrace(PTRACE_SETOPTIONS, child_pid, nullptr,
                      PTRACE_O_EXITKILL | PTRACE_O_TRACESYSGOOD))
      << strerror(errno);

  // urandom_fd tracks the file descriptor number for /dev/urandom in the child
  // process, if it opens it.
  int urandom_fd = -1;

  // sock_fd tracks the file descriptor number for the socket to the entropy
  // daemon, if one is opened.
  int sock_fd = -1;

  for (;;) {
    // Advance the child to the next system call.
    ASSERT_EQ(0, ptrace(PTRACE_SYSCALL, child_pid, 0, 0));
    ASSERT_EQ(child_pid, waitpid(child_pid, &status, 0));

    // The child may have aborted rather than made a system call.
    if (WIFSTOPPED(status) && WSTOPSIG(status) == SIGABRT) {
      out_trace->push_back(Event::Abort());
      break;
    }

    // Otherwise the only valid ptrace event is a system call stop.
    ASSERT_TRUE(WIFSTOPPED(status) && WSTOPSIG(status) == (SIGTRAP | 0x80))
        << "Child was not stopped with a syscall stop: " << status;

    struct regs regs;
    ASSERT_TRUE(regs_read(&regs, child_pid));

    bool is_opening_urandom = false;
    bool is_socket_call = false;
    bool is_socket_read = false;
    uint64_t socket_read_bytes = 0;
    // force_result is unset to indicate that the system call should run
    // normally. Otherwise it's, e.g. -EINVAL, to indicate that the system call
    // should not run and that the given value should be injected on return.
    std::optional<int> force_result;

    switch (regs.syscall) {
      case __NR_getrandom:
        if (flags & NO_GETRANDOM) {
          force_result = -ENOSYS;
        } else if (flags & GETRANDOM_ERROR) {
          force_result = -EINVAL;
        } else if (flags & GETRANDOM_NOT_READY) {
          if (regs.args[2] & GRND_NONBLOCK) {
            force_result = -EAGAIN;
          }
        }
        out_trace->push_back(
            Event::GetRandom(/*length=*/regs.args[1], /*flags=*/regs.args[2]));
        break;

      case __NR_openat:
#if defined(OPENSSL_X86_64)
      case __NR_open:
#endif
      {
        uintptr_t filename_ptr =
            (regs.syscall == __NR_openat) ? regs.args[1] : regs.args[0];
        const std::string filename =
            get_string_from_remote(child_pid, filename_ptr);
        if (filename.find("/dev/__properties__/") == 0) {
          // Android may try opening these files as part of SELinux support.
          // They are ignored here.
        } else {
          out_trace->push_back(Event::Open(filename));
        }
        is_opening_urandom = (filename == "/dev/urandom");
        if (is_opening_urandom && (flags & NO_URANDOM)) {
          force_result = -ENOENT;
        }
        break;
      }

      case __NR_read: {
        const int read_fd = regs.args[0];
        if (urandom_fd >= 0 && urandom_fd == read_fd) {
          out_trace->push_back(Event::UrandomRead(/*length=*/regs.args[2]));
          if (flags & URANDOM_ERROR) {
            force_result = -EINVAL;
          }
        } else if (sock_fd >= 0 && sock_fd == read_fd) {
          uint64_t length = regs.args[2];
          out_trace->push_back(Event::SocketRead(length));
          if (flags & SOCKET_READ_ERROR) {
            force_result = -EINVAL;
          } else {
            is_socket_read = true;
            socket_read_bytes = length;

            if (flags & SOCKET_READ_SHORT) {
              ASSERT_GT(socket_read_bytes, 0u);
              socket_read_bytes--;
              flags &= ~SOCKET_READ_SHORT;
            }
          }
        }
        break;
      }

      case __NR_close: {
        if (sock_fd >= 0 && static_cast<int>(regs.args[0]) == sock_fd) {
          out_trace->push_back(Event::SocketClose());
          sock_fd = -1;
        }
        break;
      }

      case __NR_socket: {
        const int family = regs.args[0];
        const int type = regs.args[1];
        if (family == AF_UNIX && type == SOCK_STREAM) {
          out_trace->push_back(Event::Socket());
          is_socket_call = true;
          if (flags & SOCKET_ERROR) {
            force_result = -EINVAL;
          }
        }
        break;
      }

      case __NR_connect: {
        const int connect_fd = regs.args[0];
        if (sock_fd >= 0 && connect_fd == sock_fd) {
          out_trace->push_back(Event::Connect());
          if (flags & CONNECT_ERROR) {
            force_result = -EINVAL;
          } else {
            // The test system might not have an entropy daemon running so
            // inject a success result.
            force_result = 0;
          }
        }

        break;
      }
    }

    if (force_result.has_value()) {
      ASSERT_TRUE(regs_break_syscall(child_pid, &regs));
    }

    ASSERT_EQ(0, ptrace(PTRACE_SYSCALL, child_pid, 0, 0));
    ASSERT_EQ(child_pid, waitpid(child_pid, &status, 0));
    // If the system call was exit/exit_group, the process may be terminated
    // rather than have exited the system call.
    if (WIFEXITED(status)) {
      ASSERT_EQ(0, WEXITSTATUS(status));
      return;
    }

    // Otherwise the next state must be a system call exit stop. This is
    // indistinguishable from a system call entry, we just have to keep track
    // and know that these events happen in pairs.
    ASSERT_TRUE(WIFSTOPPED(status) && WSTOPSIG(status) == (SIGTRAP | 0x80));

    if (force_result.has_value()) {
      ASSERT_TRUE(regs_set_ret(child_pid, force_result.value()));
    } else if (is_opening_urandom) {
      ASSERT_TRUE(regs_read(&regs, child_pid));
      urandom_fd = regs.ret;
    } else if (is_socket_call) {
      ASSERT_TRUE(regs_read(&regs, child_pid));
      sock_fd = regs.ret;
    } else if (is_socket_read) {
      // Simulate a response from the entropy daemon since it might not be
      // running on the current system.
      uint8_t entropy[kDaemonWriteLength];
      ASSERT_LE(socket_read_bytes, sizeof(entropy));

      for (size_t i = 0; i < sizeof(entropy); i++) {
        entropy[i] = i & 0xff;
      }
      memcpy_to_remote(child_pid, regs.args[1], entropy, socket_read_bytes);

      ASSERT_TRUE(regs_set_ret(child_pid, socket_read_bytes));
    }
  }
}